

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lib.c
# Opt level: O0

void mdname2nid(char *mdname,void *data)

{
  int iVar1;
  int *in_RSI;
  char *in_RDI;
  int *nid;
  
  if (*in_RSI == 0) {
    iVar1 = OBJ_sn2nid(in_RDI);
    *in_RSI = iVar1;
    if (*in_RSI == 0) {
      iVar1 = OBJ_ln2nid(in_RDI);
      *in_RSI = iVar1;
    }
  }
  return;
}

Assistant:

static void mdname2nid(const char *mdname, void *data)
{
    int *nid = (int *)data;

    if (*nid != NID_undef)
        return;

    *nid = OBJ_sn2nid(mdname);
    if (*nid == NID_undef)
        *nid = OBJ_ln2nid(mdname);
}